

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

bool __thiscall Assimp::Q3BSPFileParser::validateFormat(Q3BSPFileParser *this)

{
  reference pvVar1;
  sQ3BSPHeader *pHeader;
  Q3BSPFileParser *this_local;
  
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,0);
  this->m_sOffset = this->m_sOffset + 8;
  if ((((*pvVar1 == 'I') && (pvVar1[1] == 'B')) && (pvVar1[2] == 'S')) && (pvVar1[3] == 'P')) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Q3BSPFileParser::validateFormat()
{
    sQ3BSPHeader *pHeader = (sQ3BSPHeader*) &m_Data[ 0 ];
    m_sOffset += sizeof( sQ3BSPHeader );

    // Version and identify string validation
    if (pHeader->strID[ 0 ] != 'I' || pHeader->strID[ 1 ] != 'B' || pHeader->strID[ 2 ] != 'S'
        || pHeader->strID[ 3 ] != 'P')
    {
        return false;
    }

    return true;
}